

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

void __thiscall Layout::dump(Layout *this)

{
  LayoutItem *pLVar1;
  long lVar2;
  ostream *poVar3;
  _List_node_base *p_Var4;
  LayoutItem *c;
  
  pLVar1 = this->m_firstCorner;
  if (pLVar1 != (LayoutItem *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&pLVar1->m_instance);
    poVar3 = std::operator<<(poVar3," : ");
    poVar3 = std::operator<<(poVar3,(string *)&pLVar1->m_cellname);
    std::operator<<(poVar3," ");
    poVar3 = std::ostream::_M_insert<double>((&pLVar1->m_x)[this->m_dir != DIR_HORIZONTAL]);
    std::operator<<(poVar3,"\n");
  }
  p_Var4 = (_List_node_base *)&this->m_items;
  while (p_Var4 = (((_List_base<LayoutItem_*,_std::allocator<LayoutItem_*>_> *)&p_Var4->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)&this->m_items) {
    lVar2 = (long)p_Var4[1]._M_next;
    if (*(uint *)(lVar2 + 0x8c) < 2) {
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)(lVar2 + 0x10));
      poVar3 = std::operator<<(poVar3," : ");
      poVar3 = std::operator<<(poVar3,(string *)(lVar2 + 0x30));
      std::operator<<(poVar3," ");
      poVar3 = std::ostream::_M_insert<double>
                         (*(double *)(lVar2 + 0x78 + (ulong)(this->m_dir != DIR_HORIZONTAL) * 8));
      std::operator<<(poVar3,"\n");
    }
  }
  pLVar1 = this->m_lastCorner;
  if (pLVar1 != (LayoutItem *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&pLVar1->m_instance);
    poVar3 = std::operator<<(poVar3," : ");
    poVar3 = std::operator<<(poVar3,(string *)&pLVar1->m_cellname);
    std::operator<<(poVar3," ");
    poVar3 = std::ostream::_M_insert<double>((&pLVar1->m_x)[this->m_dir != DIR_HORIZONTAL]);
    std::operator<<(poVar3,"\n");
    return;
  }
  return;
}

Assistant:

void Layout::dump()
{
    if (m_firstCorner != nullptr)
    {
        auto c = m_firstCorner;
        std::cout << c->m_instance << " : " << c->m_cellname << " " << getItemPos(c) << "\n";
    }

    for(auto c : m_items)
    {
        if ((c->m_ltype == LayoutItem::TYPE_CELL) || (c->m_ltype == LayoutItem::TYPE_CORNER))
        {
            std::cout << c->m_instance << " : " << c->m_cellname << " " << getItemPos(c) << "\n";
        }
    }

    if (m_lastCorner != nullptr)
    {
        auto c = m_lastCorner;
        std::cout << c->m_instance << " : " << c->m_cellname << " " << getItemPos(c) << "\n";
    }

}